

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTOpenGlider.cpp
# Opt level: O0

char * OGNGetAcTypeName(FlarmAircraftTy _acTy)

{
  FlarmAircraftTy _acTy_local;
  char *local_8;
  
  switch(_acTy) {
  case FAT_UNKNOWN:
    local_8 = "unknown";
    break;
  case FAT_GLIDER:
    local_8 = "Glider / Motor-Glider";
    break;
  case FAT_TOW_PLANE:
    local_8 = "Tow / Tug Plane";
    break;
  case FAT_HELI_ROTOR:
    local_8 = "Helicopter, Rotorcraft";
    break;
  case FAT_PARACHUTE:
    local_8 = "Parachute";
    break;
  case FAT_DROP_PLANE:
    local_8 = "Drop Plane for parachutes";
    break;
  case FAT_HANG_GLIDER:
    local_8 = "Hangglider";
    break;
  case FAT_PARA_GLIDER:
    local_8 = "Paraglider";
    break;
  case FAT_POWERED_AC:
    local_8 = "Powered Aircraft";
    break;
  case FAT_JET_AC:
    local_8 = "Jet Aircraft";
    break;
  case FAT_UFO:
    local_8 = "Flying Saucer, UFO";
    break;
  case FAT_BALLOON:
    local_8 = "Balloon";
    break;
  case FAT_AIRSHIP:
    local_8 = "Airship";
    break;
  case FAT_UAV:
    local_8 = "Unmanned Aerial Vehicle";
    break;
  default:
    local_8 = "unknown";
    break;
  case FAT_STATIC_OBJ:
    local_8 = "Static object";
  }
  return local_8;
}

Assistant:

const char* OGNGetAcTypeName (FlarmAircraftTy _acTy)
{
    switch (_acTy) {
        case FAT_UNKNOWN:       return "unknown";
        case FAT_GLIDER:        return "Glider / Motor-Glider";
        case FAT_TOW_PLANE:     return "Tow / Tug Plane";
        case FAT_HELI_ROTOR:    return "Helicopter, Rotorcraft";
        case FAT_PARACHUTE:     return "Parachute";
        case FAT_DROP_PLANE:    return "Drop Plane for parachutes";
        case FAT_HANG_GLIDER:   return "Hangglider";
        case FAT_PARA_GLIDER:   return "Paraglider";
        case FAT_POWERED_AC:    return "Powered Aircraft";
        case FAT_JET_AC:        return "Jet Aircraft";
        case FAT_UFO:           return "Flying Saucer, UFO";
        case FAT_BALLOON:       return "Balloon";
        case FAT_AIRSHIP:       return "Airship";
        case FAT_UAV:           return "Unmanned Aerial Vehicle";
        case FAT_STATIC_OBJ:    return "Static object";
    }
    return "unknown";
}